

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int __thiscall QString::remove(QString *this,char *__filename)

{
  char16_t *first;
  char16_t *pcVar1;
  CaseSensitivity in_EDX;
  long in_FS_OFFSET;
  QStringView local_248;
  QVarLengthArray<char16_t,_256LL> local_238;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  first = *(char16_t **)(__filename + 8);
  pcVar1 = (this->d).ptr;
  if ((first < pcVar1) || (pcVar1 + (this->d).size <= first)) {
    local_238.super_QVLABase<char16_t>.super_QVLABaseBase.a = *(qsizetype *)(__filename + 0x10);
    local_238.super_QVLABase<char16_t>.super_QVLABaseBase.s = (qsizetype)first;
    removeStringImpl<QStringView>(this,(QStringView *)&local_238,in_EDX);
  }
  else {
    QVarLengthArray<char16_t,_256LL>::QVarLengthArray<const_char16_t_*,_true>
              (&local_238,first,first + *(long *)(__filename + 0x10));
    local_248.m_size = local_238.super_QVLABase<char16_t>.super_QVLABaseBase.s;
    local_248.m_data =
         (storage_type_conflict *)local_238.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
    removeStringImpl<QStringView>(this,&local_248,in_EDX);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&local_238);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(const QString &str, Qt::CaseSensitivity cs)
{
    const auto s = str.d.data();
    if (QtPrivate::q_points_into_range(s, d))
        removeStringImpl(*this, QStringView{QVarLengthArray(s, s + str.size())}, cs);
    else
        removeStringImpl(*this, qToStringViewIgnoringNull(str), cs);
    return *this;
}